

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcEdge::IfcEdge(IfcEdge *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcTopologicalRepresentationItem::IfcTopologicalRepresentationItem
            (&this->super_IfcTopologicalRepresentationItem,vtt + 1);
  pvVar1 = vtt[10];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       pvVar1;
  *(void **)(&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0xb];
  *(undefined8 *)&(this->super_IfcTopologicalRepresentationItem).field_0x28 = 0;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0xd];
  *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0xe];
  *(undefined8 *)&(this->super_IfcTopologicalRepresentationItem).field_0x30 = 0;
  (this->EdgeEnd).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcEdge() : Object("IfcEdge") {}